

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

void Kit_SopDivideInternal
               (Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,Vec_Int_t *vMemory)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar10;
  
  if (cSop->nCubes < cDiv->nCubes) {
    __assert_fail("Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                  ,0xb8,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (cDiv->nCubes == 1) {
    Kit_SopDivideByCube(cSop,cDiv,vQuo,vRem,vMemory);
    return;
  }
  vQuo->nCubes = 0;
  uVar14 = (long)cSop->nCubes / (long)cDiv->nCubes;
  iVar6 = (int)uVar14;
  if (iVar6 == 0) {
LAB_005d8afe:
    puVar7 = (uint *)0x0;
  }
  else {
    if (iVar6 < 1) goto LAB_005d8e2b;
    lVar13 = (long)iVar6 + (long)vMemory->nSize;
    iVar6 = (int)lVar13;
    vMemory->nSize = iVar6;
    if (vMemory->nCap < iVar6) goto LAB_005d8afe;
    puVar7 = (uint *)(vMemory->pArray + (lVar13 - (uVar14 & 0xffffffff)));
  }
  vQuo->pCubes = puVar7;
  uVar12 = cSop->nCubes;
  uVar14 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    puVar4 = cSop->pCubes;
    lVar13 = 0;
    uVar16 = 0;
    do {
      uVar12 = (uint)uVar14;
      uVar1 = puVar4[lVar13];
      if (uVar1 == 0) break;
      if (-1 < (int)uVar1) {
        uVar2 = cDiv->nCubes;
        if ((int)uVar2 < 1) {
          uVar17 = 0;
          uVar11 = 0;
        }
        else {
          uVar17 = 0;
          do {
            uVar11 = cDiv->pCubes[uVar17];
            if (uVar11 == 0) {
              uVar11 = 0;
              goto LAB_005d8b91;
            }
            if ((uVar11 & ~uVar1) == 0) goto LAB_005d8b91;
            uVar17 = uVar17 + 1;
          } while (uVar2 != uVar17);
          uVar17 = (ulong)uVar2;
LAB_005d8b91:
          uVar11 = ~uVar11;
        }
        if ((uint)uVar17 != uVar2) {
          uVar11 = uVar11 & uVar1;
          if ((int)uVar2 < 1) {
            uVar12 = 0;
          }
          else {
            uVar15 = 0;
            do {
              uVar8 = cDiv->pCubes[uVar15];
              if (uVar8 == 0) goto LAB_005d8c15;
              if (uVar15 != (uVar17 & 0xffffffff)) {
                if ((int)uVar12 < 1) {
                  uVar8 = 0;
                }
                else {
                  uVar9 = 0;
                  while( true ) {
                    uVar16 = puVar4[uVar9];
                    uVar10 = uVar9;
                    if (uVar16 == 0) break;
                    if ((((-1 < (int)uVar16) && ((uVar16 & uVar8) == uVar8)) &&
                        (uVar11 == (uVar16 & ~uVar8))) ||
                       (uVar9 = uVar9 + 1, uVar10 = uVar14 & 0xffffffff,
                       (uVar14 & 0xffffffff) == uVar9)) goto LAB_005d8c03;
                  }
                  uVar16 = 0;
LAB_005d8c03:
                  uVar8 = (uint)uVar10;
                }
                if (uVar8 == uVar12) goto LAB_005d8c15;
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar2);
            uVar15 = (ulong)uVar2;
LAB_005d8c15:
            uVar12 = (uint)uVar15;
          }
          if (uVar12 == uVar2) {
            iVar6 = vQuo->nCubes;
            vQuo->nCubes = iVar6 + 1;
            puVar7[iVar6] = uVar11;
            puVar4[lVar13] = uVar1 | 0x80000000;
            if (0 < cDiv->nCubes) {
              puVar5 = cDiv->pCubes;
              uVar14 = 0;
              do {
                uVar12 = puVar5[uVar14];
                if (uVar12 == 0) break;
                if (uVar14 != (uVar17 & 0xffffffff)) {
                  uVar1 = cSop->nCubes;
                  uVar15 = (ulong)uVar1;
                  bVar18 = 0 < (int)uVar1;
                  if ((int)uVar1 < 1) {
                    uVar15 = 0;
                  }
                  else {
                    uVar16 = *puVar4;
                    if (uVar16 == 0) {
                      uVar15 = 0;
                      uVar16 = 0;
                    }
                    else {
                      uVar9 = 1;
                      do {
                        if (((-1 < (int)uVar16) && ((uVar16 & uVar12) == uVar12)) &&
                           (uVar11 == (uVar16 & ~uVar12))) {
                          iVar6 = (int)uVar9;
                          goto LAB_005d8ceb;
                        }
                        bVar18 = uVar9 < uVar15;
                        if (uVar15 == uVar9) goto LAB_005d8cf4;
                        uVar16 = puVar4[uVar9];
                        uVar9 = uVar9 + 1;
                      } while (uVar16 != 0);
                      iVar6 = (int)uVar9;
                      uVar16 = 0;
LAB_005d8ceb:
                      uVar15 = (ulong)(iVar6 - 1);
                    }
                  }
LAB_005d8cf4:
                  if (!bVar18) {
                    __assert_fail("i2 < Kit_SopCubeNum(cSop)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                                  ,0xfe,
                                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                                 );
                  }
                  puVar4[uVar15] = uVar16 | 0x80000000;
                }
                uVar14 = uVar14 + 1;
              } while ((long)uVar14 < (long)cDiv->nCubes);
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
      uVar12 = cSop->nCubes;
      uVar14 = (ulong)(int)uVar12;
    } while (lVar13 < (long)uVar14);
  }
  iVar6 = cDiv->nCubes;
  iVar3 = vQuo->nCubes;
  vRem->nCubes = 0;
  uVar12 = uVar12 - iVar6 * iVar3;
  if (uVar12 != 0) {
    if ((int)uVar12 < 1) {
LAB_005d8e2b:
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar13 = (long)(int)uVar12 + (long)vMemory->nSize;
    iVar6 = (int)lVar13;
    vMemory->nSize = iVar6;
    if (iVar6 <= vMemory->nCap) {
      puVar7 = (uint *)(vMemory->pArray + (lVar13 - (ulong)uVar12));
      goto LAB_005d8d96;
    }
  }
  puVar7 = (uint *)0x0;
LAB_005d8d96:
  vRem->pCubes = puVar7;
  if (0 < cSop->nCubes) {
    puVar4 = cSop->pCubes;
    lVar13 = 0;
    do {
      uVar16 = puVar4[lVar13];
      if (uVar16 == 0) break;
      if ((int)uVar16 < 0) {
        puVar4[lVar13] = uVar16 & 0x7fffffff;
      }
      else {
        iVar6 = vRem->nCubes;
        vRem->nCubes = iVar6 + 1;
        puVar7[iVar6] = uVar16;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < cSop->nCubes);
  }
  if (uVar12 != vRem->nCubes) {
    __assert_fail("nCubesRem == Kit_SopCubeNum(vRem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                  ,0x114,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  return;
}

Assistant:

void Kit_SopDivideInternal( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    unsigned uCube2 = 0; // Suppress "might be used uninitialized"
    unsigned uDiv2, uQuo;
    int i, i2, k, k2, nCubesRem;
    assert( Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv) );
    // consider special case
    if ( Kit_SopCubeNum(cDiv) == 1 )
    {
        Kit_SopDivideByCube( cSop, cDiv, vQuo, vRem, vMemory );
        return;
    }
    // allocate quotient
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) / Kit_SopCubeNum(cDiv) );
    // for each cube of the cover
    // it either belongs to the quotient or to the remainder
    Kit_SopForEachCube( cSop, uCube, i )
    {
        // skip taken cubes
        if ( Kit_CubeIsMarked(uCube) )
            continue;
        // find a matching cube in the divisor
        uDiv = ~0;
        Kit_SopForEachCube( cDiv, uDiv, k )
            if ( Kit_CubeContains( uCube, uDiv ) )
                break;
        // the cube is not found 
        if ( k == Kit_SopCubeNum(cDiv) )
            continue;
        // the quotient cube exists
        uQuo = Kit_CubeSharp( uCube, uDiv );
        // find corresponding cubes for other cubes of the divisor
        uDiv2 = ~0;
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            // the case when the cube is not found
            if ( i2 == Kit_SopCubeNum(cSop) )
                break;
        }
        // we did not find some cubes - continue looking at other cubes
        if ( k2 != Kit_SopCubeNum(cDiv) )
            continue;
        // we found all cubes - add the quotient cube
        Kit_SopPushCube( vQuo, uQuo );

        // mark the first cube
        Kit_SopWriteCube( cSop, Kit_CubeMark(uCube), i );
        // mark other cubes that have this quotient
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            assert( i2 < Kit_SopCubeNum(cSop) );
            // the cube is found, mark it 
            // (later we will add all unmarked cubes to the remainder)
            Kit_SopWriteCube( cSop, Kit_CubeMark(uCube2), i2 );
        }
    }
    // determine the number of cubes in the remainder
    nCubesRem = Kit_SopCubeNum(cSop) - Kit_SopCubeNum(vQuo) * Kit_SopCubeNum(cDiv);
    // allocate remainder
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, nCubesRem );
    // finally add the remaining unmarked cubes to the remainder 
    // and clean the marked cubes in the cover
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( !Kit_CubeIsMarked(uCube) )
        {
            Kit_SopPushCube( vRem, uCube );
            continue;
        }
        Kit_SopWriteCube( cSop, Kit_CubeUnmark(uCube), i );
    }
    assert( nCubesRem == Kit_SopCubeNum(vRem) );
}